

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_non_base_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,false>>>
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>
                *m)

{
  bool bVar1;
  reference witness;
  column_content<typename_Matrix<Chain_vine_options_with_row_access<(Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>::Column>
  local_a0;
  reference local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint i;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40;
  undefined1 local_28 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>
  *m_local;
  
  rows.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)m;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_28);
  build_simple_chain_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,false>>>>
            ();
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_28,&local_40);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_40);
  __range1._0_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_28);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    local_70 = witness;
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,false>>>
              (&local_a0,
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>
                *)rows.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint)__range1);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,false>>>>
              (witness,&local_a0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_a0);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._0_4_ = (uint)__range1 + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_28);
  return;
}

Assistant:

void test_non_base_row_access(Matrix& m) {
  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    if constexpr (is_RU<Matrix>()) {
      rows = build_simple_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_simple_row_matrix<typename Matrix::Column>();
    }
  } else {
    rows = build_simple_chain_row_matrix<typename Matrix::Column>();
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}